

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

bool __thiscall restincurl::Worker::EvaluateState(Worker *this,bool transfersRunning,bool doDequeue)

{
  ostream *poVar1;
  byte bVar2;
  
  std::mutex::lock(&this->mutex_);
  poVar1 = std::operator<<((ostream *)&std::clog,"Run loop: transfers_running=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", do_dequeue=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", close_pending_=");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  bVar2 = this->abort_;
  if (!transfersRunning && (bool)bVar2 == false) {
    bVar2 = this->close_pending_;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool EvaluateState(const bool transfersRunning, const bool doDequeue) const noexcept {
            lock_t lock(mutex_);

            RESTINCURL_LOG_TRACE("Run loop: transfers_running=" << transfersRunning
                << ", do_dequeue=" << doDequeue
                << ", close_pending_=" << close_pending_);

            return !abort_ && (transfersRunning || !close_pending_);
        }